

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall HighsSparseMatrix::ensureRowwise(HighsSparseMatrix *this)

{
  vector<int,_std::allocator<int>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  int *piVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  HighsInt HVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  size_type __new_size;
  HighsInt iRow;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  size_type __n;
  ulong uVar15;
  vector<int,_std::allocator<int>_> ARlength;
  vector<int,_std::allocator<int>_> Aindex;
  vector<int,_std::allocator<int>_> Astart;
  vector<double,_std::allocator<double>_> Avalue;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  HighsSparseMatrix *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  value_type_conflict2 local_7c;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if ((this->format_ & ~kColwise) != kRowwise) {
    uVar1 = this->num_col_;
    uVar12 = this->num_row_;
    __n = (size_type)(int)uVar12;
    HVar8 = numNz(this);
    if (HVar8 == 0) {
      local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&this->start_,__n + 1,(value_type_conflict2 *)&local_60);
      piVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar3) {
        (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = piVar3;
      }
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar5) {
        (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar5;
      }
    }
    else {
      local_88 = &this->start_;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_60,local_88);
      __x = &this->index_;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_78,__x);
      __x_00 = &this->value_;
      local_90 = this;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_48,__x_00);
      pvVar7 = local_88;
      std::vector<int,_std::allocator<int>_>::resize(local_88,__n + 1);
      __new_size = (size_type)HVar8;
      std::vector<int,_std::allocator<int>_>::resize(__x,__new_size);
      std::vector<double,_std::allocator<double>_>::resize(__x_00,__new_size);
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_7c = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                ((vector<int,_std::allocator<int>_> *)&local_a8,__n,&local_7c);
      this = local_90;
      piVar6 = (int *)CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_60._M_impl.super__Vector_impl_data._M_start._0_4_);
      for (lVar9 = (long)*piVar6; lVar9 < (long)__new_size; lVar9 = lVar9 + 1) {
        local_a8._M_impl.super__Vector_impl_data._M_start
        [local_78._M_impl.super__Vector_impl_data._M_start[lVar9]] =
             local_a8._M_impl.super__Vector_impl_data._M_start
             [local_78._M_impl.super__Vector_impl_data._M_start[lVar9]] + 1;
      }
      piVar3 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *piVar3 = 0;
      uVar13 = 0;
      uVar15 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar15 = uVar13;
      }
      for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
        uVar12 = (int)uVar13 + local_a8._M_impl.super__Vector_impl_data._M_start[uVar14];
        uVar13 = (ulong)uVar12;
        piVar3[uVar14 + 1] = uVar12;
      }
      uVar13 = 0;
      uVar14 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar14 = uVar13;
      }
      while (uVar11 = uVar13, uVar11 != uVar14) {
        piVar4 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar9 = (long)piVar6[uVar11]; uVar13 = uVar11 + 1, lVar9 < piVar6[uVar11 + 1];
            lVar9 = lVar9 + 1) {
          iVar10 = local_78._M_impl.super__Vector_impl_data._M_start[lVar9];
          iVar2 = piVar3[iVar10];
          piVar4[iVar2] = (int)uVar11;
          pdVar5[iVar2] = local_48._M_impl.super__Vector_impl_data._M_start[lVar9];
          piVar3[iVar10] = piVar3[iVar10] + 1;
        }
      }
      *piVar3 = 0;
      iVar10 = 0;
      for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
        iVar10 = iVar10 + local_a8._M_impl.super__Vector_impl_data._M_start[uVar13];
        piVar3[uVar13 + 1] = iVar10;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
    }
    this->format_ = kRowwise;
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isRowwise() const {
  return this->format_ == MatrixFormat::kRowwise ||
         this->format_ == MatrixFormat::kRowwisePartitioned;
}